

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10ValidPolicyMappingTest13Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section10ValidPolicyMappingTest13Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.10.13";
  local_88.should_validate = true;
  PkitsTestInfo::SetInitialPolicySet(&local_88,"NIST-test-policy-1,NIST-test-policy-2");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006cced0,(char *(*) [3])&PTR_anon_var_dwarf_3f4b94_006ccfa0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10ValidPolicyMappingTest13Subpart2) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "P1anyPolicyMapping1to2CACert",
                               "ValidPolicyMappingTest13EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "P1anyPolicyMapping1to2CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.13";
  info.should_validate = true;
  info.SetInitialPolicySet("NIST-test-policy-1,NIST-test-policy-2");

  this->RunTest(certs, crls, info);
}